

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t HUF_readStats_body_bmi2
                 (BYTE *huffWeight,size_t hwSize,U32 *rankStats,U32 *nbSymbolsPtr,U32 *tableLogPtr,
                 void *src,size_t srcSize,void *workSpace,size_t wkspSize)

{
  ulong uVar1;
  long lVar2;
  size_t sVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  byte *pbVar9;
  
  if (srcSize == 0) {
    return 0xffffffffffffffb8;
  }
  uVar8 = (ulong)*src;
  if ((char)*src < '\0') {
    uVar6 = uVar8 - 0x7e >> 1;
    if (srcSize <= uVar6) {
      return 0xffffffffffffffb8;
    }
    uVar1 = uVar8 - 0x7f;
    if (hwSize <= uVar1) {
      return 0xffffffffffffffec;
    }
    if (uVar1 != 0) {
      pbVar9 = (byte *)((long)src + 1);
      lVar2 = 0;
      do {
        huffWeight[lVar2] = *pbVar9 >> 4;
        huffWeight[lVar2 + 1] = *pbVar9 & 0xf;
        lVar2 = lVar2 + 2;
        pbVar9 = pbVar9 + 1;
      } while ((uint)lVar2 < (uint)uVar1);
    }
  }
  else {
    if (srcSize <= uVar8) {
      return 0xffffffffffffffb8;
    }
    uVar1 = FSE_decompress_wksp_body_bmi2
                      (huffWeight,hwSize - 1,(void *)((long)src + 1),uVar8,6,workSpace,wkspSize);
    uVar6 = uVar8;
    if (0xffffffffffffff88 < uVar1) {
      return uVar1;
    }
  }
  rankStats[8] = 0;
  rankStats[9] = 0;
  rankStats[10] = 0;
  rankStats[0xb] = 0;
  rankStats[4] = 0;
  rankStats[5] = 0;
  rankStats[6] = 0;
  rankStats[7] = 0;
  rankStats[0] = 0;
  rankStats[1] = 0;
  rankStats[2] = 0;
  rankStats[3] = 0;
  rankStats[0xc] = 0;
  if (uVar1 == 0) {
    iVar4 = 0;
  }
  else {
    uVar8 = 0;
    uVar7 = 1;
    iVar4 = 0;
    do {
      if (0xc < (ulong)huffWeight[uVar8]) {
        return 0xffffffffffffffec;
      }
      rankStats[huffWeight[uVar8]] = rankStats[huffWeight[uVar8]] + 1;
      iVar4 = iVar4 + ((1 << (huffWeight[uVar8] & 0x1f)) >> 1);
      uVar8 = (ulong)uVar7;
      uVar7 = uVar7 + 1;
    } while (uVar8 < uVar1);
  }
  sVar3 = 0xffffffffffffffec;
  if (iVar4 != 0) {
    uVar7 = LZCOUNT(iVar4) ^ 0x1f;
    if (uVar7 < 0xc) {
      *tableLogPtr = 0x20 - LZCOUNT(iVar4);
      iVar4 = (2 << (uVar7 & 0x1f)) - iVar4;
      iVar5 = LZCOUNT(iVar4);
      if (1 << ((byte)~(byte)iVar5 & 0x1f) == iVar4) {
        uVar7 = 0x20 - iVar5;
        huffWeight[uVar1] = (BYTE)uVar7;
        rankStats[uVar7] = rankStats[uVar7] + 1;
        if ((rankStats[1] & 1) == 0 && 1 < rankStats[1]) {
          *nbSymbolsPtr = (int)uVar1 + 1;
          sVar3 = uVar6 + 1;
        }
      }
    }
  }
  return sVar3;
}

Assistant:

static BMI2_TARGET_ATTRIBUTE size_t HUF_readStats_body_bmi2(BYTE* huffWeight, size_t hwSize, U32* rankStats,
                     U32* nbSymbolsPtr, U32* tableLogPtr,
                     const void* src, size_t srcSize,
                     void* workSpace, size_t wkspSize)
{
    return HUF_readStats_body(huffWeight, hwSize, rankStats, nbSymbolsPtr, tableLogPtr, src, srcSize, workSpace, wkspSize, 1);
}